

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::MultipleConcatenationExpressionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,MultipleConcatenationExpressionSyntax *this,
          size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *node;
  ConcatenationExpressionSyntax *node_00;
  size_t index_local;
  MultipleConcatenationExpressionSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->openBrace).kind;
    token._2_1_ = (this->openBrace).field_0x2;
    token.numFlags.raw = (this->openBrace).numFlags.raw;
    token.rawLen = (this->openBrace).rawLen;
    token.info = (this->openBrace).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->expression)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 2:
    node_00 = not_null<slang::syntax::ConcatenationExpressionSyntax_*>::get(&this->concatenation);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)node_00);
    break;
  case 3:
    token_00.kind = (this->closeBrace).kind;
    token_00._2_1_ = (this->closeBrace).field_0x2;
    token_00.numFlags.raw = (this->closeBrace).numFlags.raw;
    token_00.rawLen = (this->closeBrace).rawLen;
    token_00.info = (this->closeBrace).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax MultipleConcatenationExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return openBrace;
        case 1: return expression.get();
        case 2: return concatenation.get();
        case 3: return closeBrace;
        default: return nullptr;
    }
}